

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Stress::anon_unknown_0::TextureCase::iterate(TextureCase *this)

{
  allocator<tcu::Vector<float,_2>_> *this_00;
  allocator<unsigned_short> *this_01;
  code *pcVar1;
  short sVar2;
  short sVar3;
  undefined4 uVar4;
  GLint GVar5;
  bool bVar6;
  int iVar7;
  deUint32 dVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  TestLog *this_02;
  MessageBuilder *this_03;
  RenderContext *pRVar12;
  undefined4 extraout_var;
  size_type sVar13;
  PixelBufferAccess local_2a8;
  undefined4 local_27c;
  undefined4 local_278;
  GLint samplerLoc;
  GLint texCoordLoc;
  GLint positionLoc;
  Functions *gl;
  int local_e4;
  int local_e0;
  int baseNdx;
  int y_1;
  int x_1;
  Vector<float,_4> local_d0;
  float local_c0;
  float local_bc;
  float texCoordY;
  float texCoordX;
  float posY;
  float posX;
  int y;
  int x;
  Surface resultImage;
  undefined1 local_88 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  undefined1 local_68 [8];
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> gridTexCoords;
  allocator<tcu::Vector<float,_4>_> local_39;
  undefined1 local_38 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> gridVertices;
  int gridSize;
  TextureCase *this_local;
  
  gridVertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x10;
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_39);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_38,
             0x100,&local_39);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_39);
  this_00 = (allocator<tcu::Vector<float,_2>_> *)
            ((long)&indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<tcu::Vector<float,_2>_>::allocator(this_00);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_68,
             0x100,this_00);
  std::allocator<tcu::Vector<float,_2>_>::~allocator
            ((allocator<tcu::Vector<float,_2>_> *)
             ((long)&indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  this_01 = (allocator<unsigned_short> *)((long)&resultImage.m_pixels.m_cap + 7);
  std::allocator<unsigned_short>::allocator(this_01);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_88,0x546,this_01);
  std::allocator<unsigned_short>::~allocator
            ((allocator<unsigned_short> *)((long)&resultImage.m_pixels.m_cap + 7));
  tcu::Surface::Surface((Surface *)&y,0x100,0x100);
  for (posX = 0.0; (int)posX < 0x10; posX = (float)((int)posX + 1)) {
    for (posY = 0.0; (int)posY < 0x10; posY = (float)((int)posY + 1)) {
      texCoordX = (float)(int)posX / 15.0 + (float)(int)posX / 15.0 + -1.0;
      texCoordY = (float)(int)posY / 15.0 + (float)(int)posY / 15.0 + -1.0;
      local_bc = deFloatPow(2.0,(float)(int)posX + -8.0);
      local_c0 = deFloatPow(2.0,(float)(int)posY + -8.0);
      tcu::Vector<float,_4>::Vector(&local_d0,texCoordX,texCoordY,0.0,1.0);
      pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_38,(long)((int)posX * 0x10 + (int)posY));
      *(undefined8 *)pvVar9->m_data = local_d0.m_data._0_8_;
      *(undefined8 *)(pvVar9->m_data + 2) = local_d0.m_data._8_8_;
      tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&y_1,local_bc,local_c0);
      pvVar10 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *
                           )local_68,(long)((int)posX * 0x10 + (int)posY));
      *&pvVar10->m_data = _y_1;
    }
  }
  for (baseNdx = 0; baseNdx < 0xf; baseNdx = baseNdx + 1) {
    for (local_e0 = 0; local_e0 < 0xf; local_e0 = local_e0 + 1) {
      local_e4 = (baseNdx * 0xf + local_e0) * 6;
      iVar7 = baseNdx << 4;
      sVar2 = (short)local_e0;
      pvVar11 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_88,
                           (long)local_e4);
      *pvVar11 = (short)iVar7 + sVar2;
      sVar3 = (short)baseNdx;
      sVar2 = (short)local_e0;
      pvVar11 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_88,
                           (long)(local_e4 + 1));
      *pvVar11 = (sVar3 + 1) * 0x10 + sVar2 + 1;
      sVar3 = (short)baseNdx;
      sVar2 = (short)local_e0;
      pvVar11 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_88,
                           (long)(local_e4 + 2));
      *pvVar11 = (sVar3 + 1) * 0x10 + sVar2;
      iVar7 = baseNdx << 4;
      sVar2 = (short)local_e0;
      pvVar11 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_88,
                           (long)(local_e4 + 3));
      *pvVar11 = (short)iVar7 + sVar2;
      sVar3 = (short)baseNdx;
      sVar2 = (short)local_e0;
      pvVar11 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_88,
                           (long)(local_e4 + 4));
      *pvVar11 = (sVar3 + 1) * 0x10 + sVar2 + 1;
      iVar7 = baseNdx << 4;
      sVar2 = (short)local_e0;
      pvVar11 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_88,
                           (long)(local_e4 + 5));
      *pvVar11 = (short)iVar7 + sVar2 + 1;
    }
  }
  this_02 = tcu::TestContext::getLog
                      ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&gl,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
  this_03 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&gl,
                       (char (*) [41])"Drawing a textured grid with the shader.");
  tcu::MessageBuilder::operator<<(this_03,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&gl);
  pRVar12 = Context::getRenderContext((this->super_RenderCase).super_TestCase.m_context);
  iVar7 = (*pRVar12->_vptr_RenderContext[3])();
  _texCoordLoc = CONCAT44(extraout_var,iVar7);
  pcVar1 = *(code **)(_texCoordLoc + 0x780);
  dVar8 = glu::ShaderProgram::getProgram((this->super_RenderCase).m_program);
  samplerLoc = (*pcVar1)(dVar8,"a_pos");
  pcVar1 = *(code **)(_texCoordLoc + 0x780);
  dVar8 = glu::ShaderProgram::getProgram((this->super_RenderCase).m_program);
  local_278 = (*pcVar1)(dVar8,"a_attr");
  pcVar1 = *(code **)(_texCoordLoc + 0xb48);
  dVar8 = glu::ShaderProgram::getProgram((this->super_RenderCase).m_program);
  local_27c = (*pcVar1)(dVar8,"u_sampler");
  (**(code **)(_texCoordLoc + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(_texCoordLoc + 0x188))(0x4000);
  (**(code **)(_texCoordLoc + 0x1a00))(0,0,0x100);
  pcVar1 = *(code **)(_texCoordLoc + 0x1680);
  dVar8 = glu::ShaderProgram::getProgram((this->super_RenderCase).m_program);
  (*pcVar1)(dVar8);
  (**(code **)(_texCoordLoc + 0x14f0))(local_27c,0);
  (**(code **)(_texCoordLoc + 0xb8))(0xde1,this->m_textureID);
  GVar5 = samplerLoc;
  pcVar1 = *(code **)(_texCoordLoc + 0x19f0);
  pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_38,0);
  (*pcVar1)(GVar5,4,0x1406,0,0,pvVar9);
  uVar4 = local_278;
  pcVar1 = *(code **)(_texCoordLoc + 0x19f0);
  pvVar10 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                      ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                       local_68,0);
  (*pcVar1)(uVar4,2,0x1406,0,0,pvVar10);
  (**(code **)(_texCoordLoc + 0x610))(samplerLoc);
  (**(code **)(_texCoordLoc + 0x610))(local_278);
  pcVar1 = *(code **)(_texCoordLoc + 0x568);
  sVar13 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_88);
  pvVar11 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_88,0);
  (*pcVar1)(4,sVar13 & 0xffffffff,0x1403,pvVar11);
  (**(code **)(_texCoordLoc + 0x518))(samplerLoc);
  (**(code **)(_texCoordLoc + 0x518))(local_278);
  (**(code **)(_texCoordLoc + 0x1680))(0);
  (**(code **)(_texCoordLoc + 0x648))();
  dVar8 = (**(code **)(_texCoordLoc + 0x800))();
  glu::checkError(dVar8,"TextureCase::iterate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                  ,0x4cc);
  pRVar12 = Context::getRenderContext((this->super_RenderCase).super_TestCase.m_context);
  tcu::Surface::getAccess(&local_2a8,(Surface *)&y);
  glu::readPixels(pRVar12,0,0,&local_2a8);
  bVar6 = RenderCase::checkResultImage(&this->super_RenderCase,(Surface *)&y);
  if (bVar6) {
    bVar6 = RenderCase::drawTestPattern(&this->super_RenderCase,true);
    if (bVar6) {
      tcu::TestContext::setTestResult
                ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"test pattern failed");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"missing or invalid fragments");
  }
  tcu::Surface::~Surface((Surface *)&y);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_88);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_68);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_38);
  return STOP;
}

Assistant:

TextureCase::IterateResult TextureCase::iterate (void)
{
	// Draw a grid and texture it with a floating point texture containing special values. If all goes well, nothing special should happen

	const int				gridSize		= 16;
	std::vector<tcu::Vec4>	gridVertices	(gridSize * gridSize);
	std::vector<tcu::Vec2>	gridTexCoords	(gridSize * gridSize);
	std::vector<deUint16>	indices			((gridSize - 1) * (gridSize - 1) * 6);
	tcu::Surface			resultImage		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	// vertices
	for (int x = 0; x < gridSize; ++x)
	for (int y = 0; y < gridSize; ++y)
	{
		const float posX		= (float)x / ((float)gridSize - 1.0f) * 2.0f - 1.0f; // map from [0, gridSize - 1] to [-1, 1]
		const float posY		= (float)y / ((float)gridSize - 1.0f) * 2.0f - 1.0f;
		const float texCoordX	= deFloatPow(2.0f, (float)x - (float)gridSize / 2.0f);
		const float texCoordY	= deFloatPow(2.0f, (float)y - (float)gridSize / 2.0f);

		gridVertices[x * gridSize + y]	= tcu::Vec4(posX, posY, 0.0f, 1.0f);
		gridTexCoords[x * gridSize + y]	= tcu::Vec2(texCoordX, texCoordY);
	}

	// tiles
	for (int x = 0; x < gridSize - 1; ++x)
	for (int y = 0; y < gridSize - 1; ++y)
	{
		const int baseNdx = (x * (gridSize - 1) + y) * 6;

		indices[baseNdx + 0] = (deUint16)((x+0) * gridSize + (y+0));
		indices[baseNdx + 1] = (deUint16)((x+1) * gridSize + (y+1));
		indices[baseNdx + 2] = (deUint16)((x+1) * gridSize + (y+0));

		indices[baseNdx + 3] = (deUint16)((x+0) * gridSize + (y+0));
		indices[baseNdx + 4] = (deUint16)((x+1) * gridSize + (y+1));
		indices[baseNdx + 5] = (deUint16)((x+0) * gridSize + (y+1));
	}

	m_testCtx.getLog() << tcu::TestLog::Message << "Drawing a textured grid with the shader." << tcu::TestLog::EndMessage;

	// Draw grid
	{
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const GLint				positionLoc	= gl.getAttribLocation(m_program->getProgram(), "a_pos");
		const GLint				texCoordLoc	= gl.getAttribLocation(m_program->getProgram(), "a_attr");
		const GLint				samplerLoc	= gl.getUniformLocation(m_program->getProgram(), "u_sampler");

		gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		gl.viewport(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		gl.useProgram(m_program->getProgram());

		gl.uniform1i(samplerLoc, 0);
		gl.bindTexture(GL_TEXTURE_2D, m_textureID);

		gl.vertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, &gridVertices[0]);
		gl.vertexAttribPointer(texCoordLoc, 2, GL_FLOAT, GL_FALSE, 0, &gridTexCoords[0]);

		gl.enableVertexAttribArray(positionLoc);
		gl.enableVertexAttribArray(texCoordLoc);
		gl.drawElements(GL_TRIANGLES, (glw::GLsizei)(indices.size()), GL_UNSIGNED_SHORT, &indices[0]);
		gl.disableVertexAttribArray(positionLoc);
		gl.disableVertexAttribArray(texCoordLoc);

		gl.useProgram(0);
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "TextureCase::iterate");

		glu::readPixels(m_context.getRenderContext(), 0, 0, resultImage.getAccess());
	}

	// verify everywhere was drawn (all pixels have Green = 255)
	if (!checkResultImage(resultImage))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "missing or invalid fragments");
		return STOP;
	}

	// test drawing and textures still works
	if (!drawTestPattern(true))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "test pattern failed");
		return STOP;
	}

	// all ok
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}